

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void Refresh(CPpmd8 *p,CTX_PTR ctx,uint oldNU,uint scale)

{
  uint uVar1;
  byte bVar2;
  byte *local_38;
  CPpmd_State *s;
  uint flags;
  uint sumFreq;
  uint escFreq;
  uint i;
  uint scale_local;
  uint oldNU_local;
  CTX_PTR ctx_local;
  CPpmd8 *p_local;
  
  sumFreq = (uint)ctx->NumStats;
  local_38 = (byte *)ShrinkUnits(p,p->Base + ctx->Stats,oldNU,sumFreq + 2 >> 1);
  ctx->Stats = (int)local_38 - (int)p->Base;
  s._0_4_ = ((uint)ctx->Flags & scale * 4 + 0x10) + (uint)(0x3f < *local_38) * 8;
  flags = (uint)ctx->SummFreq - (uint)local_38[1];
  bVar2 = (byte)scale;
  uVar1 = local_38[1] + scale >> (bVar2 & 0x1f);
  local_38[1] = (byte)uVar1;
  s._4_4_ = uVar1 & 0xff;
  do {
    flags = flags - local_38[7];
    uVar1 = local_38[7] + scale >> (bVar2 & 0x1f);
    local_38[7] = (byte)uVar1;
    s._4_4_ = (uVar1 & 0xff) + s._4_4_;
    s._0_4_ = (uint)(0x3f < local_38[6]) << 3 | (uint)s;
    sumFreq = sumFreq - 1;
    local_38 = local_38 + 6;
  } while (sumFreq != 0);
  ctx->SummFreq = (short)s._4_4_ + (short)(flags + scale >> (bVar2 & 0x1f));
  ctx->Flags = (Byte)(uint)s;
  return;
}

Assistant:

static void Refresh(CPpmd8 *p, CTX_PTR ctx, unsigned oldNU, unsigned scale)
{
  unsigned i = ctx->NumStats, escFreq, sumFreq, flags;
  CPpmd_State *s = (CPpmd_State *)ShrinkUnits(p, STATS(ctx), oldNU, (i + 2) >> 1);
  ctx->Stats = REF(s);
  #ifdef PPMD8_FREEZE_SUPPORT
  /* fixed over Shkarin's code. Fixed code is not compatible with original code for some files in FREEZE mode. */
  scale |= (ctx->SummFreq >= ((UInt32)1 << 15));
  #endif
  flags = (ctx->Flags & (0x10 + 0x04 * scale)) + 0x08 * (s->Symbol >= 0x40);
  escFreq = ctx->SummFreq - s->Freq;
  sumFreq = (s->Freq = (Byte)((s->Freq + scale) >> scale));
  do
  {
    escFreq -= (++s)->Freq;
    sumFreq += (s->Freq = (Byte)((s->Freq + scale) >> scale));
    flags |= 0x08 * (s->Symbol >= 0x40);
  }
  while (--i);
  ctx->SummFreq = (UInt16)(sumFreq + ((escFreq + scale) >> scale));
  ctx->Flags = (Byte)flags;
}